

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O3

void * Cnf_DataWriteIntoSolver2(Cnf_Dat_t *p,int nFrames,int fInit)

{
  bool bVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  sat_solver2 *s;
  ulong uVar5;
  Aig_Man_t *pAVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int Lits [1];
  undefined8 local_60;
  lit local_58;
  int local_54;
  uint local_50;
  int local_4c;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfMan.c"
                  ,0x1e3,"void *Cnf_DataWriteIntoSolver2(Cnf_Dat_t *, int, int)");
  }
  s = sat_solver2_new();
  sat_solver2_setnvars(s,p->nVars * nFrames);
  lVar7 = 0;
  do {
    if (p->nClauses <= lVar7) {
      if (nFrames != 1) {
        local_54 = p->nVars * 2;
        local_40 = *p->pClauses;
        uVar5 = 1;
        bVar1 = true;
        local_50 = nFrames;
        do {
          pAVar6 = p->pMan;
          iVar4 = pAVar6->nRegs;
          local_48 = uVar5;
          if (0 < iVar4) {
            local_38 = (ulong)(uint)(((int)uVar5 + -1) * local_54);
            uVar12 = (int)uVar5 * local_54;
            iVar9 = 0;
            do {
              uVar11 = (pAVar6->nObjs[3] - iVar4) + iVar9;
              if (((int)uVar11 < 0) || (pAVar6->vCos->nSize <= (int)uVar11)) goto LAB_0055db1d;
              uVar10 = (pAVar6->nObjs[2] - iVar4) + iVar9;
              if (((int)uVar10 < 0) || (pAVar6->vCis->nSize <= (int)uVar10)) goto LAB_0055db1d;
              local_60 = CONCAT44((uVar12 | 1) +
                                  p->pVarNums[*(int *)((long)pAVar6->vCis->pArray[uVar10] + 0x24)] *
                                  2,(int)local_38 +
                                    p->pVarNums[*(int *)((long)pAVar6->vCos->pArray[uVar11] + 0x24)]
                                    * 2);
              iVar4 = sat_solver2_addclause(s,(lit *)&local_60,&local_58,0);
              if (iVar4 == 0) goto LAB_0055da77;
              local_60 = CONCAT44((int)((ulong)local_60 >> 0x20) + -1,(int)local_60 + 1);
              iVar4 = sat_solver2_addclause(s,(lit *)&local_60,&local_58,0);
              if (iVar4 == 0) goto LAB_0055da77;
              iVar9 = iVar9 + 1;
              pAVar6 = p->pMan;
              iVar4 = pAVar6->nRegs;
            } while (iVar9 < iVar4);
          }
          piVar3 = local_40;
          uVar2 = local_48;
          if (0 < p->nLiterals) {
            lVar7 = 0;
            do {
              local_40[lVar7] = local_40[lVar7] + local_54;
              lVar7 = lVar7 + 1;
            } while (lVar7 < p->nLiterals);
          }
          lVar7 = 0;
          while (lVar7 < p->nClauses) {
            iVar4 = sat_solver2_addclause(s,p->pClauses[lVar7],p->pClauses[lVar7 + 1],0);
            lVar7 = lVar7 + 1;
            if (iVar4 == 0) goto LAB_0055da77;
          }
          uVar12 = (int)uVar2 + 1;
          uVar5 = (ulong)uVar12;
          bVar1 = (int)uVar12 < (int)local_50;
        } while (uVar12 != local_50);
        if (0 < p->nLiterals) {
          lVar7 = 0;
          do {
            piVar3[lVar7] = piVar3[lVar7] - (int)uVar2 * local_54;
            lVar7 = lVar7 + 1;
          } while (lVar7 < p->nLiterals);
        }
        if ((int)uVar12 < (int)local_50) {
          return (void *)0x0;
        }
      }
      goto LAB_0055da8e;
    }
    iVar4 = sat_solver2_addclause(s,p->pClauses[lVar7],p->pClauses[lVar7 + 1],0);
    lVar7 = lVar7 + 1;
  } while (iVar4 != 0);
  goto LAB_0055d88a;
LAB_0055da77:
  sat_solver2_delete(s);
  if (bVar1) {
    return (void *)0x0;
  }
LAB_0055da8e:
  if (fInit != 0) {
    pAVar6 = p->pMan;
    uVar12 = pAVar6->nObjs[2] - pAVar6->nRegs;
    pVVar8 = pAVar6->vCis;
    if ((int)uVar12 < pVVar8->nSize) {
      uVar5 = (ulong)uVar12;
      do {
        if ((int)uVar12 < 0) {
LAB_0055db1d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        local_4c = p->pVarNums[*(int *)((long)pVVar8->pArray[uVar5] + 0x24)] * 2 + 1;
        iVar4 = sat_solver2_addclause(s,&local_4c,(lit *)&local_48,0);
        if (iVar4 == 0) goto LAB_0055d88a;
        uVar5 = uVar5 + 1;
        pVVar8 = p->pMan->vCis;
      } while ((int)uVar5 < pVVar8->nSize);
    }
  }
  iVar4 = sat_solver2_simplify(s);
  if (iVar4 != 0) {
    return s;
  }
LAB_0055d88a:
  sat_solver2_delete(s);
  return (void *)0x0;
}

Assistant:

void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit )
{
    sat_solver2 * pSat;
    int i, f, status;
    assert( nFrames > 0 );
    pSat = sat_solver2_new();
    sat_solver2_setnvars( pSat, p->nVars * nFrames );
    for ( i = 0; i < p->nClauses; i++ )
    {
        if ( !sat_solver2_addclause( pSat, p->pClauses[i], p->pClauses[i+1], 0 ) )
        {
            sat_solver2_delete( pSat );
            return NULL;
        }
    }
    if ( nFrames > 1 )
    {
        Aig_Obj_t * pObjLo, * pObjLi;
        int nLitsAll, * pLits, Lits[2];
        nLitsAll = 2 * p->nVars;
        pLits = p->pClauses[0];
        for ( f = 1; f < nFrames; f++ )
        {
            // add equality of register inputs/outputs for different timeframes
            Aig_ManForEachLiLoSeq( p->pMan, pObjLi, pObjLo, i )
            {
                Lits[0] = (f-1)*nLitsAll + toLitCond( p->pVarNums[pObjLi->Id], 0 );
                Lits[1] =  f   *nLitsAll + toLitCond( p->pVarNums[pObjLo->Id], 1 );
                if ( !sat_solver2_addclause( pSat, Lits, Lits + 2, 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
                Lits[0]++;
                Lits[1]--;
                if ( !sat_solver2_addclause( pSat, Lits, Lits + 2, 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
            }
            // add clauses for the next timeframe
            for ( i = 0; i < p->nLiterals; i++ )
                pLits[i] += nLitsAll;
            for ( i = 0; i < p->nClauses; i++ )
            {
                if ( !sat_solver2_addclause( pSat, p->pClauses[i], p->pClauses[i+1], 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
            }
        }
        // return literals to their original state
        nLitsAll = (f-1) * nLitsAll;
        for ( i = 0; i < p->nLiterals; i++ )
            pLits[i] -= nLitsAll;
    }
    if ( fInit )
    {
        Aig_Obj_t * pObjLo;
        int Lits[1];
        Aig_ManForEachLoSeq( p->pMan, pObjLo, i )
        {
            Lits[0] = toLitCond( p->pVarNums[pObjLo->Id], 1 );
            if ( !sat_solver2_addclause( pSat, Lits, Lits + 1, 0 ) )
            {
                sat_solver2_delete( pSat );
                return NULL;
            }
        }
    }
    status = sat_solver2_simplify(pSat);
    if ( status == 0 )
    {
        sat_solver2_delete( pSat );
        return NULL;
    }
    return pSat;
}